

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

int SUNDlsMat_denseGEQRF(realtype **a,sunindextype m,sunindextype n,realtype *beta,realtype *v)

{
  realtype *prVar1;
  realtype *prVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double __x;
  double dVar12;
  
  lVar7 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  uVar8 = 0;
  while( true ) {
    uVar4 = uVar8 & 0xffffffff;
    if ((int)uVar8 < n) {
      uVar4 = (ulong)(uint)n;
    }
    if (uVar8 == uVar6) break;
    prVar1 = a[uVar8];
    dVar11 = prVar1[uVar8];
    *v = 1.0;
    lVar9 = (long)m - uVar8;
    dVar12 = 0.0;
    for (lVar3 = 1; lVar3 < lVar9; lVar3 = lVar3 + 1) {
      dVar10 = *(double *)((long)prVar1 + lVar3 * 8 + lVar7);
      v[lVar3] = dVar10;
      dVar12 = dVar12 + dVar10 * dVar10;
    }
    uVar5 = uVar8;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      __x = dVar11 * dVar11 + dVar12;
      dVar10 = 0.0;
      if (0.0 < __x) {
        if (__x < 0.0) {
          dVar10 = sqrt(__x);
        }
        else {
          dVar10 = SQRT(__x);
        }
      }
      dVar10 = (double)(-(ulong)(0.0 < dVar11) & (ulong)(-dVar12 / (dVar10 + dVar11)) |
                       ~-(ulong)(0.0 < dVar11) & (ulong)(dVar11 - dVar10));
      dVar11 = dVar10 * dVar10;
      beta[uVar8] = (dVar11 + dVar11) / (dVar12 + dVar11);
      for (lVar3 = 1; lVar3 < lVar9; lVar3 = lVar3 + 1) {
        v[lVar3] = v[lVar3] / dVar10;
      }
    }
    else {
      beta[uVar8] = 0.0;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      prVar2 = a[uVar5];
      dVar11 = 0.0;
      for (lVar3 = 0; lVar3 < lVar9; lVar3 = lVar3 + 1) {
        dVar11 = dVar11 + *(double *)((long)prVar2 + lVar3 * 8 + lVar7) * v[lVar3];
      }
      dVar12 = beta[uVar8];
      for (lVar3 = 0; lVar3 < lVar9; lVar3 = lVar3 + 1) {
        *(double *)((long)prVar2 + lVar3 * 8 + lVar7) =
             v[lVar3] * -dVar11 * dVar12 + *(double *)((long)prVar2 + lVar3 * 8 + lVar7);
      }
    }
    if ((long)uVar8 < (long)(m + -1)) {
      for (lVar3 = 1; lVar3 < lVar9; lVar3 = lVar3 + 1) {
        *(realtype *)((long)prVar1 + lVar3 * 8 + lVar7) = v[lVar3];
      }
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 8;
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseGEQRF(realtype **a, sunindextype m, sunindextype n, realtype *beta, realtype *v)
{
  realtype ajj, s, mu, v1, v1_2;
  realtype *col_j, *col_k;
  sunindextype i, j, k;

  /* For each column...*/
  for(j=0; j<n; j++) {

    col_j = a[j];

    ajj = col_j[j];

    /* Compute the j-th Householder vector (of length m-j) */
    v[0] = ONE;
    s = ZERO;
    for(i=1; i<m-j; i++) {
      v[i] = col_j[i+j];
      s += v[i]*v[i];
    }

    if(s != ZERO) {
      mu = SUNRsqrt(ajj*ajj+s);
      v1 = (ajj <= ZERO) ? ajj-mu : -s/(ajj+mu);
      v1_2 = v1*v1;
      beta[j] = TWO * v1_2 / (s + v1_2);
      for(i=1; i<m-j; i++) v[i] /= v1;
    } else {
      beta[j] = ZERO;
    }

    /* Update upper triangle of A (load R) */
    for(k=j; k<n; k++) {
      col_k = a[k];
      s = ZERO;
      for(i=0; i<m-j; i++) s += col_k[i+j]*v[i];
      s *= beta[j];
      for(i=0; i<m-j; i++) col_k[i+j] -= s*v[i];
    }

    /* Update A (load Householder vector) */
    if(j<m-1) {
      for(i=1; i<m-j; i++) col_j[i+j] = v[i];
    }

  }


  return(0);
}